

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O3

int CfdSignEcdsaAdaptor(void *handle,char *msg,char *sk,char *adaptor,char **adaptor_signature,
                       char **adaptor_proof)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  CfdException *pCVar5;
  AdaptorPair pair;
  char *work_signature;
  allocator local_123;
  allocator local_122;
  allocator local_121;
  AdaptorPair local_120;
  Privkey local_f0;
  string local_d0;
  char *local_b0;
  undefined8 local_a8;
  Pubkey local_a0;
  ByteData256 local_88;
  string local_70;
  string local_50;
  
  local_b0 = (char *)0x0;
  local_a8 = 0;
  cfd::Initialize();
  bVar2 = cfd::capi::IsEmptyString(msg);
  if (bVar2) {
    local_120.signature.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    local_120.signature.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0xdc;
    local_120.signature.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdSignEcdsaAdaptor";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_120,kCfdLogLevelWarning,"msg is null or empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_120.signature.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)&local_120.signature.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"Failed to parameter. msg is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_120);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar2 = cfd::capi::IsEmptyString(sk);
  if (bVar2) {
    local_120.signature.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    local_120.signature.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0xe2;
    local_120.signature.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdSignEcdsaAdaptor";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_120,kCfdLogLevelWarning,"sk is null or empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_120.signature.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)&local_120.signature.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"Failed to parameter. sk is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_120);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar2 = cfd::capi::IsEmptyString(adaptor);
  if (bVar2) {
    local_120.signature.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    local_120.signature.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0xe8;
    local_120.signature.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdSignEcdsaAdaptor";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_120,kCfdLogLevelWarning,"adaptor is null or empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_120.signature.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)&local_120.signature.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"Failed to parameter. adaptor is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_120);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (adaptor_signature != (char **)0x0) {
    if (adaptor_proof != (char **)0x0) {
      std::__cxx11::string::string((string *)&local_d0,msg,&local_121);
      cfd::core::ByteData256::ByteData256(&local_88,&local_d0);
      std::__cxx11::string::string((string *)&local_50,sk,&local_122);
      cfd::core::Privkey::Privkey(&local_f0,&local_50,kMainnet,true);
      std::__cxx11::string::string((string *)&local_70,adaptor,&local_123);
      cfd::core::Pubkey::Pubkey(&local_a0,&local_70);
      cfd::core::AdaptorUtil::Sign(&local_120,&local_88,&local_f0,&local_a0);
      if (local_a0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (local_f0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (local_88.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      paVar1 = &local_d0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      cfd::core::AdaptorSignature::GetData(&local_f0.data_,&local_120.signature);
      cfd::core::ByteData::GetHex_abi_cxx11_(&local_d0,&local_f0.data_);
      pcVar3 = cfd::capi::CreateString(&local_d0);
      local_b0 = pcVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if (local_f0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      cfd::core::AdaptorProof::GetData(&local_f0.data_,&local_120.proof);
      cfd::core::ByteData::GetHex_abi_cxx11_(&local_d0,&local_f0.data_);
      pcVar4 = cfd::capi::CreateString(&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if (local_f0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      *adaptor_signature = pcVar3;
      *adaptor_proof = pcVar4;
      if (local_120.proof.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_120.proof.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_120.signature.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_120.signature.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return 0;
    }
    local_120.signature.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    local_120.signature.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0xf4;
    local_120.signature.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdSignEcdsaAdaptor";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_120,kCfdLogLevelWarning,"adaptor proof is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_120.signature.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)&local_120.signature.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"Failed to parameter. adaptor proof is null.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_120);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_120.signature.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
  local_120.signature.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0xee;
  local_120.signature.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdSignEcdsaAdaptor";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)&local_120,kCfdLogLevelWarning,"adaptor signature is null.");
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  local_120.signature.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_120.signature.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl +
                0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_120,"Failed to parameter. adaptor signature is null.","");
  cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_120);
  __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdSignEcdsaAdaptor(
    void* handle, const char* msg, const char* sk, const char* adaptor,
    char** adaptor_signature, char** adaptor_proof) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_signature = nullptr;
  char* work_proof = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(msg)) {
      warn(CFD_LOG_SOURCE, "msg is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. msg is null or empty.");
    }
    if (IsEmptyString(sk)) {
      warn(CFD_LOG_SOURCE, "sk is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. sk is null or empty.");
    }
    if (IsEmptyString(adaptor)) {
      warn(CFD_LOG_SOURCE, "adaptor is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor is null or empty.");
    }
    if (adaptor_signature == nullptr) {
      warn(CFD_LOG_SOURCE, "adaptor signature is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor signature is null.");
    }
    if (adaptor_proof == nullptr) {
      warn(CFD_LOG_SOURCE, "adaptor proof is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor proof is null.");
    }

    AdaptorPair pair =
        AdaptorUtil::Sign(ByteData256(msg), Privkey(sk), Pubkey(adaptor));

    work_signature = CreateString(pair.signature.GetData().GetHex());
    work_proof = CreateString(pair.proof.GetData().GetHex());

    *adaptor_signature = work_signature;
    *adaptor_proof = work_proof;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_signature, &work_proof);
  return result;
}